

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O1

bool __thiscall
ObjectModelBuilder::buildClass(ObjectModelBuilder *this,object *classObject,bool declaration)

{
  _Base_ptr p_Var1;
  _Alloc_hider _Var2;
  bool bVar3;
  bool bVar4;
  Class *clazz;
  mapped_type *ppCVar5;
  ostream *poVar6;
  const_iterator cVar7;
  string *resourceString;
  object *object;
  long lVar8;
  char *pcVar9;
  _Base_ptr p_Var10;
  undefined1 local_b8 [8];
  string alloc;
  string name;
  undefined1 local_50 [8];
  string include;
  
  findStringInObject((string *)((long)&alloc.field_2 + 8),classObject,"name");
  if (name._M_dataplus._M_p == (pointer)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: class ",0xd);
    pcVar9 = "";
    if (declaration) {
      pcVar9 = "declaration";
    }
    lVar8 = 0xb;
    if (!declaration) {
      lVar8 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," missing \'name\'",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    goto LAB_0010c4cf;
  }
  clazz = (Class *)operator_new(0xe8);
  memset(clazz,0,0xe8);
  (clazz->name)._M_dataplus._M_p = (pointer)&(clazz->name).field_2;
  (clazz->name)._M_string_length = 0;
  (clazz->name).field_2._M_local_buf[0] = '\0';
  (clazz->include)._M_dataplus._M_p = (pointer)&(clazz->include).field_2;
  (clazz->include)._M_string_length = 0;
  (clazz->include).field_2._M_local_buf[0] = '\0';
  (clazz->alloc)._M_dataplus._M_p = (pointer)&(clazz->alloc).field_2;
  (clazz->alloc)._M_string_length = 0;
  (clazz->alloc).field_2._M_local_buf[0] = '\0';
  clazz->declarationOnly = false;
  (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (clazz->signals).super__Vector_base<Signal,_std::allocator<Signal>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (clazz->signals).super__Vector_base<Signal,_std::allocator<Signal>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (clazz->signals).super__Vector_base<Signal,_std::allocator<Signal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (clazz->functions).super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (clazz->functions).super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (clazz->functions).super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (clazz->resources).super__Vector_base<Resource,_std::allocator<Resource>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (clazz->resources).super__Vector_base<Resource,_std::allocator<Resource>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (clazz->resources).super__Vector_base<Resource,_std::allocator<Resource>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)clazz);
  ppCVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
            ::operator[](&this->m_classes,(key_type *)((long)&alloc.field_2 + 8));
  *ppCVar5 = clazz;
  if (declaration) {
    findStringInObject((string *)local_50,classObject,"include");
    if (include._M_dataplus._M_p == (pointer)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: class ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"declaration",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," missing \'include\', name=",0x19);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)alloc.field_2._8_8_,
                          (long)name._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if (local_50 != (undefined1  [8])&include._M_string_length) {
        operator_delete((void *)local_50);
      }
      goto LAB_0010c4cf;
    }
    findStringInObject((string *)local_b8,classObject,"alloc");
    _Var2 = alloc._M_dataplus;
    if (alloc._M_dataplus._M_p == (pointer)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: class ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"declaration",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," missing \'alloc\', name=",0x17);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)alloc.field_2._8_8_,
                          (long)name._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
LAB_0010c69f:
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    else {
      std::__cxx11::string::_M_assign((string *)&clazz->include);
      std::__cxx11::string::_M_assign((string *)&clazz->alloc);
      clazz->declarationOnly = true;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->m_includes,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      if (this->m_verbose == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Class (declaration): name=\'",0x1b);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)alloc.field_2._8_8_,
                            (long)name._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' include=\'",0xb);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)local_50,(long)include._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' alloc=\'",9);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)local_b8,(long)alloc._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        goto LAB_0010c69f;
      }
    }
    if (local_b8 != (undefined1  [8])&alloc._M_string_length) {
      operator_delete((void *)local_b8);
    }
    if (local_50 != (undefined1  [8])&include._M_string_length) {
      operator_delete((void *)local_50);
    }
    if (_Var2._M_p == (pointer)0x0) goto LAB_0010c4cf;
  }
  else if (this->m_verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Class: name=\'",0xd);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)alloc.field_2._8_8_,
                        (long)name._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  local_50 = (undefined1  [8])&include._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"properties","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
          ::find(&classObject->_M_t,(key_type *)local_50);
  if (local_50 != (undefined1  [8])&include._M_string_length) {
    operator_delete((void *)local_50);
  }
  name.field_2._8_8_ = &(classObject->_M_t)._M_impl.super__Rb_tree_header;
  if (cVar7._M_node != (_Base_ptr)name.field_2._8_8_) {
    if (cVar7._M_node[2]._M_color == 3) {
      bVar3 = buildProperty(this,(string *)cVar7._M_node[2]._M_parent,clazz);
      if (bVar3) goto LAB_0010c817;
    }
    else {
      if (cVar7._M_node[2]._M_color == 4) {
        p_Var10 = *(_Base_ptr *)cVar7._M_node[2]._M_parent;
        p_Var1 = (cVar7._M_node[2]._M_parent)->_M_parent;
        if (p_Var10 != p_Var1) {
          do {
            picojson::value::value((value *)local_50,(value *)p_Var10);
            bVar3 = buildMaybeProperty(this,(value *)local_50,clazz);
            _Var2 = include._M_dataplus;
            if (local_50._0_4_ == 5) {
              if (include._M_dataplus._M_p != (pointer)0x0) {
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                             *)include._M_dataplus._M_p);
                goto LAB_0010c7db;
              }
            }
            else if (local_50._0_4_ == 4) {
              if (include._M_dataplus._M_p != (pointer)0x0) {
                std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                          ((vector<picojson::value,_std::allocator<picojson::value>_> *)
                           include._M_dataplus._M_p);
                goto LAB_0010c7db;
              }
            }
            else if ((local_50._0_4_ == 3) && (include._M_dataplus._M_p != (pointer)0x0)) {
              if (*include._M_dataplus._M_p != include._M_dataplus._M_p + 0x10) {
                operator_delete(*include._M_dataplus._M_p);
              }
LAB_0010c7db:
              operator_delete(_Var2._M_p);
            }
            if (!bVar3) goto LAB_0010c4cf;
            p_Var10 = (_Base_ptr)&p_Var10->_M_left;
          } while (p_Var10 != p_Var1);
        }
        goto LAB_0010c817;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: invalid property in class=",0x21);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)alloc.field_2._8_8_,
                          (long)name._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    goto LAB_0010c4cf;
  }
LAB_0010c817:
  local_50 = (undefined1  [8])&include._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"signals","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
          ::find(&classObject->_M_t,(key_type *)local_50);
  if (local_50 != (undefined1  [8])&include._M_string_length) {
    operator_delete((void *)local_50);
  }
  if (cVar7._M_node != (_Base_ptr)name.field_2._8_8_) {
    if (cVar7._M_node[2]._M_color == 3) {
      bVar3 = buildSignal(this,(string *)cVar7._M_node[2]._M_parent,clazz);
      if (bVar3) goto LAB_0010c9a1;
    }
    else {
      if (cVar7._M_node[2]._M_color == 4) {
        p_Var10 = *(_Base_ptr *)cVar7._M_node[2]._M_parent;
        p_Var1 = (cVar7._M_node[2]._M_parent)->_M_parent;
        if (p_Var10 != p_Var1) {
          do {
            picojson::value::value((value *)local_50,(value *)p_Var10);
            bVar3 = buildMaybeSignal(this,(value *)local_50,clazz);
            _Var2 = include._M_dataplus;
            if (local_50._0_4_ == 5) {
              if (include._M_dataplus._M_p != (pointer)0x0) {
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                             *)include._M_dataplus._M_p);
                goto LAB_0010c904;
              }
            }
            else if (local_50._0_4_ == 4) {
              if (include._M_dataplus._M_p != (pointer)0x0) {
                std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                          ((vector<picojson::value,_std::allocator<picojson::value>_> *)
                           include._M_dataplus._M_p);
                goto LAB_0010c904;
              }
            }
            else if ((local_50._0_4_ == 3) && (include._M_dataplus._M_p != (pointer)0x0)) {
              if (*include._M_dataplus._M_p != include._M_dataplus._M_p + 0x10) {
                operator_delete(*include._M_dataplus._M_p);
              }
LAB_0010c904:
              operator_delete(_Var2._M_p);
            }
            if (!bVar3) goto LAB_0010c4cf;
            p_Var10 = (_Base_ptr)&p_Var10->_M_left;
          } while (p_Var10 != p_Var1);
        }
        goto LAB_0010c9a1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: invalid signal in class=",0x1f);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)alloc.field_2._8_8_,
                          (long)name._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    goto LAB_0010c4cf;
  }
LAB_0010c9a1:
  local_50 = (undefined1  [8])&include._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"functions","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
          ::find(&classObject->_M_t,(key_type *)local_50);
  if (local_50 != (undefined1  [8])&include._M_string_length) {
    operator_delete((void *)local_50);
  }
  if (cVar7._M_node != (_Base_ptr)name.field_2._8_8_) {
    if (cVar7._M_node[2]._M_color == 3) {
      buildFunction(this,(string *)cVar7._M_node[2]._M_parent,clazz);
    }
    else {
      if (cVar7._M_node[2]._M_color != 4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"error: invalid function in class=",0x21);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)alloc.field_2._8_8_,
                            (long)name._M_dataplus._M_p);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        goto LAB_0010c4cf;
      }
      p_Var10 = *(_Base_ptr *)cVar7._M_node[2]._M_parent;
      p_Var1 = (cVar7._M_node[2]._M_parent)->_M_parent;
      if (p_Var10 != p_Var1) {
        do {
          picojson::value::value((value *)local_50,(value *)p_Var10);
          bVar3 = buildMaybeFunction(this,(value *)local_50,clazz);
          _Var2 = include._M_dataplus;
          if (local_50._0_4_ == 5) {
            if (include._M_dataplus._M_p != (pointer)0x0) {
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                           *)include._M_dataplus._M_p);
              goto LAB_0010ca8e;
            }
          }
          else if (local_50._0_4_ == 4) {
            if (include._M_dataplus._M_p != (pointer)0x0) {
              std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                        ((vector<picojson::value,_std::allocator<picojson::value>_> *)
                         include._M_dataplus._M_p);
              goto LAB_0010ca8e;
            }
          }
          else if ((local_50._0_4_ == 3) && (include._M_dataplus._M_p != (pointer)0x0)) {
            if (*include._M_dataplus._M_p != include._M_dataplus._M_p + 0x10) {
              operator_delete(*include._M_dataplus._M_p);
            }
LAB_0010ca8e:
            operator_delete(_Var2._M_p);
          }
          if (!bVar3) goto LAB_0010c4cf;
          p_Var10 = (_Base_ptr)&p_Var10->_M_left;
        } while (p_Var10 != p_Var1);
      }
    }
  }
  local_50 = (undefined1  [8])&include._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"resources","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
          ::find(&classObject->_M_t,(key_type *)local_50);
  if (local_50 != (undefined1  [8])&include._M_string_length) {
    operator_delete((void *)local_50);
  }
  if (cVar7._M_node == (_Base_ptr)name.field_2._8_8_) {
LAB_0010ccbb:
    if (!declaration) {
      local_50 = (undefined1  [8])&include._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"root","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
              ::find(&classObject->_M_t,(key_type *)local_50);
      if (local_50 != (undefined1  [8])&include._M_string_length) {
        operator_delete((void *)local_50);
      }
      if ((cVar7._M_node != (_Base_ptr)name.field_2._8_8_) &&
         (bVar3 = buildObject(this,(value *)(cVar7._M_node + 2),(Object *)0x0,clazz), !bVar3))
      goto LAB_0010c4cf;
    }
    local_50 = (undefined1  [8])&include._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"replicators","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
            ::find(&classObject->_M_t,(key_type *)local_50);
    if (local_50 != (undefined1  [8])&include._M_string_length) {
      operator_delete((void *)local_50);
    }
    bVar3 = true;
    if (cVar7._M_node == (_Base_ptr)name.field_2._8_8_) goto LAB_0010c4d2;
    if (cVar7._M_node[2]._M_color == 5) {
      object = picojson::value::
               get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                         ((value *)(cVar7._M_node + 2));
      bVar4 = buildReplicator(this,object,clazz);
      if (bVar4) goto LAB_0010c4d2;
    }
    else {
      if (cVar7._M_node[2]._M_color == 4) {
        p_Var1 = (cVar7._M_node[2]._M_parent)->_M_parent;
        for (p_Var10 = *(_Base_ptr *)cVar7._M_node[2]._M_parent; p_Var10 != p_Var1;
            p_Var10 = (_Base_ptr)&p_Var10->_M_left) {
          picojson::value::value((value *)local_50,(value *)p_Var10);
          bVar4 = buildMaybeReplicator(this,(value *)local_50,clazz);
          _Var2 = include._M_dataplus;
          if (local_50._0_4_ == 5) {
            if (include._M_dataplus._M_p != (pointer)0x0) {
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                           *)include._M_dataplus._M_p);
              goto LAB_0010ce11;
            }
          }
          else if (local_50._0_4_ == 4) {
            if (include._M_dataplus._M_p != (pointer)0x0) {
              std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                        ((vector<picojson::value,_std::allocator<picojson::value>_> *)
                         include._M_dataplus._M_p);
              goto LAB_0010ce11;
            }
          }
          else if ((local_50._0_4_ == 3) && (include._M_dataplus._M_p != (pointer)0x0)) {
            if (*include._M_dataplus._M_p != include._M_dataplus._M_p + 0x10) {
              operator_delete(*include._M_dataplus._M_p);
            }
LAB_0010ce11:
            operator_delete(_Var2._M_p);
          }
          if (!bVar4) goto LAB_0010c4cf;
        }
        goto LAB_0010c4d2;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: invalid \'replicators\' in class=",0x26);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)alloc.field_2._8_8_,
                          (long)name._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  else if (cVar7._M_node[2]._M_color == 3) {
    resourceString = picojson::value::get<std::__cxx11::string>((value *)(cVar7._M_node + 2));
    bVar3 = buildResource(this,resourceString,clazz);
    if (bVar3) goto LAB_0010ccbb;
  }
  else {
    if (cVar7._M_node[2]._M_color == 4) {
      p_Var10 = *(_Base_ptr *)cVar7._M_node[2]._M_parent;
      p_Var1 = (cVar7._M_node[2]._M_parent)->_M_parent;
      if (p_Var10 != p_Var1) {
        do {
          picojson::value::value((value *)local_50,(value *)p_Var10);
          bVar3 = buildMaybeResource(this,(value *)local_50,clazz);
          _Var2 = include._M_dataplus;
          if (local_50._0_4_ == 5) {
            if (include._M_dataplus._M_p != (pointer)0x0) {
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                           *)include._M_dataplus._M_p);
              goto LAB_0010cc10;
            }
          }
          else if (local_50._0_4_ == 4) {
            if (include._M_dataplus._M_p != (pointer)0x0) {
              std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                        ((vector<picojson::value,_std::allocator<picojson::value>_> *)
                         include._M_dataplus._M_p);
              goto LAB_0010cc10;
            }
          }
          else if ((local_50._0_4_ == 3) && (include._M_dataplus._M_p != (pointer)0x0)) {
            if (*include._M_dataplus._M_p != include._M_dataplus._M_p + 0x10) {
              operator_delete(*include._M_dataplus._M_p);
            }
LAB_0010cc10:
            operator_delete(_Var2._M_p);
          }
          if (!bVar3) goto LAB_0010c4cf;
          p_Var10 = (_Base_ptr)&p_Var10->_M_left;
        } while (p_Var10 != p_Var1);
      }
      goto LAB_0010ccbb;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: invalid resource in class=",0x21);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)alloc.field_2._8_8_,
                        (long)name._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
LAB_0010c4cf:
  bVar3 = false;
LAB_0010c4d2:
  if ((size_type *)alloc.field_2._8_8_ != &name._M_string_length) {
    operator_delete((void *)alloc.field_2._8_8_);
  }
  return bVar3;
}

Assistant:

bool ObjectModelBuilder::buildClass(const picojson::object &classObject, bool declaration)
{
    // Class *clazz = new Class();
    std::string name = findStringInObject(classObject, "name");
    if (name.empty()) {
        std::cerr << "error: class " << (declaration ? "declaration" : "") << " missing 'name'" << std::endl;
        return false;
    }

    Class *clazz = new Class();
    clazz->name = name;
    m_classes[name] = clazz;

    if (declaration) {
        std::string include = findStringInObject(classObject, "include");
        if (include.empty()) {
            std::cerr << "error: class " << (declaration ? "declaration" : "") << " missing 'include', name=" << name << std::endl;
            return false;
        }
        std::string alloc = findStringInObject(classObject, "alloc");
        if (alloc.empty()) {
            std::cerr << "error: class " << (declaration ? "declaration" : "") << " missing 'alloc', name=" << name << std::endl;
            return false;
        }
        clazz->include = include;
        clazz->alloc = alloc;
        clazz->declarationOnly = true;

        m_includes.insert(include);
        if (m_verbose)
            std::cerr << "Class (declaration): name='" << name << "' include='" << include << "' alloc='" << alloc << "'" << std::endl;
    } else {
        if (m_verbose)
            std::cerr << "Class: name='" << name << "'" << std::endl;
    }


    auto propertyIt = classObject.find("properties");
    if (propertyIt != classObject.end()) {
        const picojson::value &props = propertyIt->second;
        if (props.is<picojson::array>()) {
            for (auto prop : props.get<picojson::array>()) {
                if (!buildMaybeProperty(prop, clazz))
                    return false;
            }
        } else if (props.is<std::string>()) {
            if (!buildProperty(props.get<std::string>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid property in class=" << name << std::endl;
            return false;
        }
    }

    auto signalIt = classObject.find("signals");
    if (signalIt != classObject.end()) {
        const picojson::value &signals = signalIt->second;
        if (signals.is<picojson::array>()) {
            for (auto signal : signals.get<picojson::array>())
                if (!buildMaybeSignal(signal, clazz))
                    return false;
        } else if (signals.is<std::string>()) {
            if (!buildSignal(signals.get<std::string>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid signal in class=" << name << std::endl;
            return false;
        }
    }

    auto functionsIt = classObject.find("functions");
    if (functionsIt != classObject.end()) {
        const picojson::value &functions = functionsIt->second;
        if (functions.is<picojson::array>()) {
            for (auto function : functions.get<picojson::array>())
                if (!buildMaybeFunction(function, clazz))
                    return false;
        } else if (functions.is<std::string>()) {
            if (!buildFunction(functions.get<std::string>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid function in class=" << name << std::endl;
            return false;
        }
    }

    auto resourcesIt = classObject.find("resources");
    if (resourcesIt != classObject.end()) {
        const picojson::value &resources = resourcesIt->second;
        if (resources.is<picojson::array>()) {
            for (auto resource : resources.get<picojson::array>())
                if (!buildMaybeResource(resource, clazz))
                    return false;
        } else if (resources.is<std::string>()) {
            if (!buildResource(resources.get<std::string>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid resource in class=" << name << std::endl;
            return false;
        }
    }

    if (!declaration) {
        auto rootIt = classObject.find("root");
        if (rootIt != classObject.end()) {
            const picojson::value &root = rootIt->second;
            if (!buildObject(root, 0, clazz))
                return false;
        }

    }

    auto replicatorsIt = classObject.find("replicators");
    if (replicatorsIt != classObject.end()) {
        const picojson::value &replicators = replicatorsIt->second;
        if (replicators.is<picojson::array>()) {
            for (auto replicator : replicators.get<picojson::array>())
                if (!buildMaybeReplicator(replicator, clazz))
                    return false;
        } else if (replicators.is<picojson::object>()) {
            if (!buildReplicator(replicators.get<picojson::object>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid 'replicators' in class=" << name << std::endl;
            return false;
        }
    }

    return true;
}